

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  char_t *end;
  char_t *begin;
  bool bVar1;
  
  do {
    if (((anonymous_namespace)::chartype_table[(byte)*s] & 1) == 0) {
      if (((anonymous_namespace)::chartype_table[((byte *)s)[1]] & 1) != 0) {
        s = (char_t *)((byte *)s + 1);
        goto LAB_00331a42;
      }
      if (((anonymous_namespace)::chartype_table[((byte *)s)[2]] & 1) != 0) {
        s = (char_t *)((byte *)s + 2);
        goto LAB_00331a42;
      }
      bVar1 = ((anonymous_namespace)::chartype_table[((byte *)s)[3]] & 1) == 0;
      if (bVar1) {
        s = (char_t *)((byte *)s + 4);
      }
      else {
        s = (char_t *)((byte *)s + 3);
      }
    }
    else {
LAB_00331a42:
      bVar1 = false;
    }
    if (!bVar1) {
      if (*s == 0) {
        *s = 0;
        return s;
      }
      if (*s == 0x3c) {
        *s = 0;
        return (char_t *)((byte *)s + 1);
      }
      s = (char_t *)((byte *)s + 1);
    }
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}